

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.c
# Opt level: O2

_Bool upb_MapIterator_Next(upb_Map *map,size_t *iter)

{
  _Bool _Var1;
  upb_strtable_iter it;
  upb_strtable_iter local_20;
  
  local_20.t = &map->table;
  local_20.index = *iter;
  upb_strtable_next(&local_20);
  *iter = local_20.index;
  _Var1 = upb_strtable_done(&local_20);
  if (_Var1) {
    _Var1 = false;
  }
  else {
    _Var1 = ((local_20.t)->t).entries != (upb_tabent *)0x0;
  }
  return _Var1;
}

Assistant:

bool upb_MapIterator_Next(const upb_Map* map, size_t* iter) {
  return _upb_map_next(map, iter);
}